

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.h
# Opt level: O2

BasicStatus __thiscall ipx::Basis::StatusOf(Basis *this,Int j)

{
  int iVar1;
  BasicStatus BVar2;
  
  iVar1 = (this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[j];
  BVar2 = (uint)(this->model_->num_rows_ <= iVar1);
  if (iVar1 < 0) {
    BVar2 = (uint)(iVar1 == -1) | NONBASIC_FIXED;
  }
  return BVar2;
}

Assistant:

inline Basis::BasicStatus Basis::StatusOf(Int j) const {
    const Int m = model_.rows();
    const Int p = map2basis_[j];
    assert(p >= -2 && p < 2*m);
    if (p < 0)
        return p == -1 ? NONBASIC : NONBASIC_FIXED;
    else
        return p < m ? BASIC : BASIC_FREE;
}